

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::MessagePattern::preParse
          (MessagePattern *this,UnicodeString *pattern,UParseError *parseError,UErrorCode *errorCode
          )

{
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  if (parseError != (UParseError *)0x0) {
    parseError->line = 0;
    parseError->offset = 0;
    parseError->preContext[0] = L'\0';
    parseError->postContext[0] = L'\0';
  }
  UnicodeString::operator=(&this->msg,pattern);
  this->partsLength = 0;
  this->numericValuesLength = 0;
  *(undefined4 *)((long)&this->numericValuesLength + 3) = 0;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }